

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O1

int __thiscall
cmCTestScriptHandler::ExecuteScript(cmCTestScriptHandler *this,string *total_script_arg)

{
  cmCTest *pcVar1;
  bool bVar2;
  char **ppcVar3;
  int iVar4;
  int iVar5;
  string *psVar6;
  ostream *poVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  pointer pbVar9;
  cmsysProcess *cp;
  char *pcVar10;
  long *plVar11;
  size_t sVar12;
  ulong uVar13;
  char **ppcVar14;
  long lVar15;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  string line;
  vector<char,_std::allocator<char>_> err;
  vector<char,_std::allocator<char>_> out;
  ostringstream cmCTestLog_msg;
  ostringstream cmCTestLog_msg_7;
  cmCTestScriptHandler *local_3c8;
  cmsysProcess *local_3c0;
  char **local_3b8;
  char **ppcStack_3b0;
  long local_3a8;
  string local_398;
  long *local_378;
  long local_370;
  long local_368 [2];
  vector<char,_std::allocator<char>_> local_358;
  vector<char,_std::allocator<char>_> local_338;
  undefined1 local_320 [376];
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  local_3b8 = (char **)0x0;
  ppcStack_3b0 = (char **)0x0;
  local_3a8 = 0;
  local_3c8 = this;
  psVar6 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  local_320._0_8_ = (psVar6->_M_dataplus)._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_3b8,(char **)local_320);
  local_320._0_8_ = "-SR";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_3b8,(char **)local_320);
  local_320._0_8_ = (total_script_arg->_M_dataplus)._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_3b8,(char **)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"Executable for CTest is: ",0x19);
  psVar6 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  pcVar1 = (local_3c8->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
               ,0x91,(char *)local_1a8._0_8_,false);
  if ((_func_int **)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  pvVar8 = cmCTest::GetInitialCommandLineArguments_abi_cxx11_
                     ((local_3c8->super_cmCTestGenericHandler).CTest);
  pbVar9 = (pvVar8->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(pvVar8->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9)) {
    uVar13 = 1;
    lVar15 = 0x20;
    do {
      local_320._0_8_ = *(undefined8 *)((long)&(pbVar9->_M_dataplus)._M_p + lVar15);
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_3b8,(char **)local_320);
      uVar13 = uVar13 + 1;
      pbVar9 = (pvVar8->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0x20;
    } while (uVar13 < (ulong)((long)(pvVar8->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5)
            );
  }
  local_320._0_8_ = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_3b8,(char **)local_320);
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp,local_3b8);
  cmsysProcess_SetOption(cp,0,1);
  cmsysProcess_Execute(cp);
  local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  local_398._M_string_length = 0;
  local_398.field_2._M_local_buf[0] = '\0';
  iVar4 = cmSystemTools::WaitForLine
                    (cp,&local_398,(cmDuration)0x4059000000000000,&local_338,&local_358);
  local_3c0 = cp;
  while (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"Output: ",8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_320,local_398._M_dataplus._M_p,local_398._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    pcVar1 = (local_3c8->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0xab,(char *)local_1a8._0_8_,false);
    cp = local_3c0;
    if ((_func_int **)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
    if (iVar4 == 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_320,local_398._M_dataplus._M_p,local_398._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      pcVar1 = (local_3c8->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                   ,0xaf,(char *)local_1a8._0_8_,false);
LAB_001e67c5:
      cp = local_3c0;
      if ((_func_int **)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
    }
    else if (iVar4 == 3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_320,local_398._M_dataplus._M_p,local_398._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      pcVar1 = (local_3c8->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                   ,0xad,(char *)local_1a8._0_8_,false);
      goto LAB_001e67c5;
    }
    iVar4 = cmSystemTools::WaitForLine
                      (cp,&local_398,(cmDuration)0x4059000000000000,&local_338,&local_358);
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  iVar4 = cmsysProcess_GetState(cp);
  iVar5 = 0;
  bVar2 = false;
  switch(iVar4) {
  case 1:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tError executing ctest: ",0x18);
    pcVar10 = cmsysProcess_GetErrorString(local_3c0);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)&local_3c8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0xa8);
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar10,sVar12);
    }
    std::ios::widen((char)(ostream *)local_320 + (char)*(_func_int **)(local_320._0_8_ + -0x18));
    std::ostream::put((char)local_320);
    std::ostream::flush();
    pcVar1 = (local_3c8->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0xca,(char *)local_1a8._0_8_,false);
    goto LAB_001e6a74;
  case 2:
    iVar5 = cmsysProcess_GetExitException(local_3c0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tThere was an exception: ",0x19);
    pcVar10 = cmsysProcess_GetExceptionString(local_3c0);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)&local_3c8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0xa8);
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar10,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
    plVar11 = (long *)std::ostream::operator<<(local_320,iVar5);
    std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
    std::ostream::put((char)plVar11);
    std::ostream::flush();
    pcVar1 = (local_3c8->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0xc1,(char *)local_1a8._0_8_,false);
    if ((_func_int **)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
    bVar2 = true;
    break;
  case 4:
    iVar5 = cmsysProcess_GetExitValue(local_3c0);
    bVar2 = false;
    break;
  case 5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tThere was a timeout",0x14);
    std::ios::widen((char)(ostream *)local_320 + (char)*(_func_int **)(local_320._0_8_ + -0x18));
    std::ostream::put((char)local_320);
    std::ostream::flush();
    pcVar1 = (local_3c8->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0xc5,(char *)local_1a8._0_8_,false);
LAB_001e6a74:
    if ((_func_int **)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
    bVar2 = true;
    iVar5 = 0;
  }
  cmsysProcess_Delete(local_3c0);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"Error running command: [",0x18);
    poVar7 = (ostream *)std::ostream::operator<<(local_320,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
    ppcVar3 = ppcStack_3b0;
    if (local_3b8 != ppcStack_3b0) {
      ppcVar14 = local_3b8;
      do {
        pcVar10 = *ppcVar14;
        if (pcVar10 != (char *)0x0) {
          sVar12 = strlen(pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar10,sVar12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
        }
        ppcVar14 = ppcVar14 + 1;
      } while (ppcVar14 != ppcVar3);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__cxx11::stringbuf::str();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_378,local_370);
    pcVar10 = *local_3b8;
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
    }
    else {
      sVar12 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,sVar12);
    }
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (local_378 != local_368) {
      operator_delete(local_378,local_368[0] + 1);
    }
    pcVar1 = (local_3c8->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0xd8,(char *)local_378,false);
    if (local_378 != local_368) {
      operator_delete(local_378,local_368[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
    iVar5 = -1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,
                    CONCAT71(local_398.field_2._M_allocated_capacity._1_7_,
                             local_398.field_2._M_local_buf[0]) + 1);
  }
  if (local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3b8 != (char **)0x0) {
    operator_delete(local_3b8,local_3a8 - (long)local_3b8);
  }
  return iVar5;
}

Assistant:

int cmCTestScriptHandler::ExecuteScript(const std::string& total_script_arg)
{
  // execute the script passing in the arguments to the script as well as the
  // arguments from this invocation of cmake
  std::vector<const char*> argv;
  argv.push_back(cmSystemTools::GetCTestCommand().c_str());
  argv.push_back("-SR");
  argv.push_back(total_script_arg.c_str());

  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             "Executable for CTest is: " << cmSystemTools::GetCTestCommand()
                                         << "\n");

  // now pass through all the other arguments
  std::vector<std::string>& initArgs =
    this->CTest->GetInitialCommandLineArguments();
  //*** need to make sure this does not have the current script ***
  for (size_t i = 1; i < initArgs.size(); ++i) {
    argv.push_back(initArgs[i].c_str());
  }
  argv.push_back(nullptr);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  // cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  // cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  std::vector<char> out;
  std::vector<char> err;
  std::string line;
  int pipe =
    cmSystemTools::WaitForLine(cp, line, std::chrono::seconds(100), out, err);
  while (pipe != cmsysProcess_Pipe_None) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Output: " << line << "\n");
    if (pipe == cmsysProcess_Pipe_STDERR) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, line << "\n");
    } else if (pipe == cmsysProcess_Pipe_STDOUT) {
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, line << "\n");
    }
    pipe = cmSystemTools::WaitForLine(cp, line, std::chrono::seconds(100), out,
                                      err);
  }

  // Properly handle output of the build command
  cmsysProcess_WaitForExit(cp, nullptr);
  int result = cmsysProcess_GetState(cp);
  int retVal = 0;
  bool failed = false;
  if (result == cmsysProcess_State_Exited) {
    retVal = cmsysProcess_GetExitValue(cp);
  } else if (result == cmsysProcess_State_Exception) {
    retVal = cmsysProcess_GetExitException(cp);
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "\tThere was an exception: "
                 << cmsysProcess_GetExceptionString(cp) << " " << retVal
                 << std::endl);
    failed = true;
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "\tThere was a timeout" << std::endl);
    failed = true;
  } else if (result == cmsysProcess_State_Error) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "\tError executing ctest: " << cmsysProcess_GetErrorString(cp)
                                           << std::endl);
    failed = true;
  }
  cmsysProcess_Delete(cp);
  if (failed) {
    std::ostringstream message;
    message << "Error running command: [";
    message << result << "] ";
    for (const char* arg : argv) {
      if (arg) {
        message << arg << " ";
      }
    }
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               message.str() << argv[0] << std::endl);
    return -1;
  }
  return retVal;
}